

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall
QColumnViewDelegate::paint
          (QColumnViewDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  LayoutDirection LVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LVar1 = (option->super_QStyleOption).direction;
  iVar3 = (((option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i) * 2
          + 2) / 3;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  if (LVar1 == RightToLeft) {
    local_108.super_QStyleOption.rect.x1.m_i = local_108.super_QStyleOption.rect.x1.m_i + iVar3;
  }
  else {
    local_108.super_QStyleOption.rect.x2.m_i = local_108.super_QStyleOption.rect.x2.m_i - iVar3;
  }
  pQVar2 = (index->m).ptr;
  uVar5 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,index);
  if ((uVar5 & 0x20) == 0) {
    local_108.showDecorationSelected = true;
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
  }
  QStyledItemDelegate::paint((QStyledItemDelegate *)this,painter,&local_108,index);
  if (LVar1 == RightToLeft) {
    local_108.super_QStyleOption.rect.x1.m_i = (option->super_QStyleOption).rect.x1.m_i;
    local_108.super_QStyleOption.rect.x2.m_i = local_108.super_QStyleOption.rect.x1.m_i + iVar3 + -1
    ;
  }
  else {
    local_108.super_QStyleOption.rect.x2.m_i = (option->super_QStyleOption).rect.x2.m_i;
    local_108.super_QStyleOption.rect.x1.m_i =
         (local_108.super_QStyleOption.rect.x2.m_i - iVar3) + 1;
  }
  local_108.super_QStyleOption.rect.y1.m_i = (option->super_QStyleOption).rect.y1.m_i;
  local_108.super_QStyleOption.rect.y2.m_i = (option->super_QStyleOption).rect.y2.m_i;
  pQVar2 = (index->m).ptr;
  cVar4 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,index);
  if (cVar4 != '\0') {
    if (local_108.widget == (QWidget *)0x0) {
      pQVar6 = QApplication::style();
    }
    else {
      pQVar6 = QWidget::style(local_108.widget);
    }
    (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x2a,&local_108,painter,local_108.widget);
  }
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    bool reverse = (option.direction == Qt::RightToLeft);
    int width = ((option.rect.height() * 2) / 3);
    // Modify the options to give us room to add an arrow
    QStyleOptionViewItem opt = option;
    if (reverse)
        opt.rect.adjust(width,0,0,0);
    else
        opt.rect.adjust(0,0,-width,0);

    if (!(index.model()->flags(index) & Qt::ItemIsEnabled)) {
        opt.showDecorationSelected = true;
        opt.state |= QStyle::State_Selected;
    }

    QStyledItemDelegate::paint(painter, opt, index);

    if (reverse)
        opt.rect = QRect(option.rect.x(), option.rect.y(), width, option.rect.height());
    else
        opt.rect = QRect(option.rect.x() + option.rect.width() - width, option.rect.y(),
                         width, option.rect.height());

    // Draw >
    if (index.model()->hasChildren(index)) {
        const QWidget *view = opt.widget;
        QStyle *style = view ? view->style() : QApplication::style();
        style->drawPrimitive(QStyle::PE_IndicatorColumnViewArrow, &opt, painter, view);
    }
}